

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastQueue.cpp
# Opt level: O2

Bucket * __thiscall FastQueue::dequeue(FastQueue *this)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  pthread_mutex_t *__mutex_00;
  
  __mutex = &this->global_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  while( true ) {
    uVar1 = this->head;
    if (uVar1 != this->tail) break;
    pthread_cond_wait((pthread_cond_t *)&this->empty_cond,(pthread_mutex_t *)__mutex);
  }
  __mutex_00 = Bucket::get_mutex((this->buckets).
                                 super__Vector_base<Bucket_*,_std::allocator<Bucket_*>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar1]);
  pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
  this->head = (this->head + 1) % this->num_buckets;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_cond_signal((pthread_cond_t *)&this->full_cond);
  return (this->buckets).super__Vector_base<Bucket_*,_std::allocator<Bucket_*>_>._M_impl.
         super__Vector_impl_data._M_start[(int)uVar1];
}

Assistant:

Bucket* FastQueue::dequeue(){
    int bucket_index;
    pthread_mutex_lock(&global_mutex);                          //lock global mutex to avoid  
    
    while(empty()){
        pthread_cond_wait(&empty_cond, &global_mutex);          //the thread block if the queue is empty
    }
    
    
    bucket_index = head;
    
    pthread_mutex_lock(&(buckets[head]->get_mutex()));            //lock the bukcet to avoid the comprtition between enqueue and dequeue threads
  
    head = (head + 1) % num_buckets;
    
    pthread_mutex_unlock(&global_mutex);                        //Here, may lead long time block, if the bucket is not consumed.
    
    pthread_cond_signal(&full_cond);

 
    return buckets[bucket_index];
}